

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O1

size_t __thiscall
SGParser::Generator::Grammar::CreateTerminalVector
          (Grammar *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pterminalVec,Lex *lex)

{
  uint *puVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  size_t sVar4;
  size_type *psVar5;
  uint *puVar6;
  _Rb_tree_header *p_Var7;
  long *local_70 [2];
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((lex->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl
      .super__Vector_impl_data._M_finish ==
      (lex->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl
      .super__Vector_impl_data._M_start) {
    sVar4 = 0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(pterminalVec,
                      (pterminalVec->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pterminalVec,
               (char (*) [11])"TokenError");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pterminalVec,
               (char (*) [9])"TokenEOF");
    puVar1 = (lex->TokenLexemes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (lex->TokenLexemes).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pterminalVec,
                  &(lex->Lexemes).
                   super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                   super__Vector_impl_data._M_start[*puVar6].Name);
    }
    p_Var3 = (this->GrammarSymbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var7 = &(this->GrammarSymbols)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var7) {
      do {
        if ((p_Var3[2]._M_color & 0x40000000) != _S_red) {
          std::__cxx11::string::substr((ulong)local_70,(ulong)(p_Var3 + 1));
          plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x14d68b);
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_50.field_2._M_allocated_capacity = *psVar5;
            local_50.field_2._8_8_ = plVar2[3];
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = *psVar5;
            local_50._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_50._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     pterminalVec,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var7);
    }
    sVar4 = (long)(pterminalVec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pterminalVec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
  }
  return sVar4;
}

Assistant:

size_t Grammar::CreateTerminalVector(std::vector<String>& pterminalVec, const Lex& lex) const {
    // Make sure there are lexemes to deal with
    if (lex.Lexemes.size() == 0u)
        return 0u;

    // Make sure the std::vector is empty
    pterminalVec.clear();

    // Add the hard-coded default terminals
    pterminalVec.emplace_back("TokenError");
    pterminalVec.emplace_back("TokenEOF");

    // Add all the lexemes
    for (const auto lexeme: lex.TokenLexemes)
        pterminalVec.push_back(lex.Lexemes[lexeme].Name);

    // Go through grammar symbols and save the named error terminals
    for (const auto& [str, prod]: GrammarSymbols)
        if (prod & ProductionMask::ErrorTerminal)
            pterminalVec.push_back("TokenError_" + str.substr(6u, str.size() - 7u));

    return pterminalVec.size();
}